

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_crg_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  jpc_crgcomp_t *pjVar2;
  int iVar3;
  
  pjVar2 = (ms->parms).crg.comps;
  iVar3 = 0;
  while( true ) {
    if ((ms->parms).soc <= iVar3) {
      return 0;
    }
    iVar1 = jpc_putuint16(out,pjVar2->hoff);
    if ((iVar1 != 0) || (iVar1 = jpc_putuint16(out,pjVar2->voff), iVar1 != 0)) break;
    iVar3 = iVar3 + 1;
    pjVar2 = pjVar2 + 1;
  }
  return -1;
}

Assistant:

static int jpc_crg_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		if (jpc_putuint16(out, comp->hoff) ||
		  jpc_putuint16(out, comp->voff)) {
			return -1;
		}
	}
	return 0;
}